

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

_Bool arm_generate_debug_exceptions(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  if (env->aarch64 == 0) {
    uVar1 = env->features;
    if (((uint)uVar1 >> 9 & 1) == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          bVar6 = uVar3 == 0x16;
          if (!bVar6) {
            bVar6 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar1 >> 0x1c & 1) == 0) && (uVar3 = 3, bVar6)) goto LAB_006132c5;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = 1;
      if ((env->v7m).exception == 0) {
        uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
      }
    }
LAB_006132c5:
    if (uVar3 == 0) {
      uVar4 = uVar1 >> 0x1c & 0xffffffff;
      if ((uVar1 & 0x200000000) != 0) {
        uVar4 = 0;
      }
      if ((~uVar1 & 0x210000000) == 0) {
        uVar4 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
      }
      if (((uVar1 >> 0x20 & 1) != 0) &&
         (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
        if ((uVar4 & 1) == 0) {
          uVar4 = 0;
        }
        else {
          uVar4 = (env->cp15).hcr_el2 >> 0x1f;
        }
      }
      if ((uVar4 & 1) != 0) goto aa64_generate_debug_exceptions;
    }
    if ((uVar1 & 0x200000000) != 0) {
      bVar6 = (env->uncached_cpsr & 0x1f) == 0x16;
      if (!bVar6) {
        bVar6 = ((env->cp15).scr_el3 & 1) == 0;
      }
      if (bVar6) {
        if ((uVar3 == 0) && (((env->cp15).sder & 1) != 0)) {
          return true;
        }
        bVar6 = ((env->cp15).mdcr_el3 & 0xc000) == 0x8000;
        goto LAB_00613371;
      }
    }
    bVar6 = uVar3 == 2;
LAB_00613371:
    return !bVar6;
  }
aa64_generate_debug_exceptions:
  uVar1 = env->features;
  uVar3 = (uint)uVar1;
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 == 0x10) {
        uVar2 = 0;
      }
      else if (uVar2 == 0x16) {
        uVar2 = 3;
      }
      else if (uVar2 == 0x1a) {
        uVar2 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar6 = uVar2 == 0x16;
          if (!bVar6) {
            bVar6 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar3 >> 0x1c & 1) == 0) && (uVar2 = 3, bVar6)) goto LAB_0061376b;
        }
        uVar2 = 1;
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar2 = 1;
    if ((env->v7m).exception == 0) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061376b:
  if (uVar2 == 3) {
    return false;
  }
  if ((uVar1 >> 0x21 & 1) != 0) {
    if ((((env->cp15).scr_el3 & 1) == 0) && (((env->cp15).mdcr_el3 & 0x10000) != 0)) {
      return false;
    }
    if ((uVar1 & 0x200000000) != 0) {
      if (env->aarch64 == 0) {
        bVar6 = (env->uncached_cpsr & 0x1f) == 0x16;
      }
      else {
        bVar6 = (~env->pstate & 0xc) == 0;
      }
      if (!bVar6) {
        bVar6 = ((env->cp15).scr_el3 & 1) == 0;
      }
      goto LAB_006137a1;
    }
  }
  bVar6 = false;
LAB_006137a1:
  if (((((uVar1 >> 0x20 & 1) == 0) || (bVar6)) ||
      ((uVar5 = 2, ((env->cp15).hcr_el2 & 0x8000000) == 0 && (((env->cp15).mdcr_el2 & 0x100) == 0)))
      ) && (((uVar1 & 0x200000000) == 0 || (uVar5 = 3, !(bool)((uVar3 >> 0x1c & 1) == 0 & bVar6)))))
  {
    uVar5 = 1;
  }
  if (uVar2 == uVar5) {
    if (((env->cp15).mdscr_el1 & 0x2000) == 0) {
      return false;
    }
    return (env->daif & 0x200) == 0;
  }
  return uVar2 < uVar5;
}

Assistant:

static inline bool arm_generate_debug_exceptions(CPUARMState *env)
{
    if (env->aarch64) {
        return aa64_generate_debug_exceptions(env);
    } else {
        return aa32_generate_debug_exceptions(env);
    }
}